

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O0

VNode * despot::DPOMCP::ConstructTree
                  (vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
                  RandomStreams *streams,DSPOMDP *model,POMCPPrior *prior,History *history,
                  double timeout)

{
  POMCPPrior *pPVar1;
  int iVar2;
  reference ppSVar3;
  ulong uVar4;
  size_type sVar5;
  clock_t cVar6;
  undefined4 extraout_var;
  log_ostream *plVar7;
  ostream *poVar8;
  void *pvVar9;
  ValuedAction VVar10;
  ValuedAction local_b0;
  State *local_a0;
  State *particle;
  int index;
  int num_sims;
  double start;
  VNode *pVStack_80;
  int i;
  VNode *root;
  History local_68;
  double local_38;
  double timeout_local;
  History *history_local;
  POMCPPrior *prior_local;
  DSPOMDP *model_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  
  local_38 = timeout;
  timeout_local = (double)history;
  history_local = (History *)prior;
  prior_local = (POMCPPrior *)model;
  model_local = (DSPOMDP *)streams;
  streams_local = (RandomStreams *)particles;
  History::History(&local_68,history);
  (*prior->_vptr_POMCPPrior[5])(prior,&local_68);
  History::~History(&local_68);
  ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                      ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)streams_local,0)
  ;
  pVStack_80 = POMCP::CreateVNode(0,*ppSVar3,(POMCPPrior *)history_local,(DSPOMDP *)prior_local);
  for (start._4_4_ = 0; uVar4 = (ulong)start._4_4_,
      sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)streams_local)
      , iVar2 = start._4_4_, uVar4 < sVar5; start._4_4_ = start._4_4_ + 1) {
    ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)streams_local,
                         (long)start._4_4_);
    (*ppSVar3)->scenario_id = iVar2;
  }
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar7 = logging::stream(3);
    poVar8 = std::operator<<(&plVar7->super_ostream,
                             "[DPOMCP::ConstructTree] # active particles before search = ");
    iVar2 = (*prior_local->_vptr_POMCPPrior[0x18])();
    pvVar9 = (void *)std::ostream::operator<<(poVar8,iVar2);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  }
  cVar6 = clock();
  _index = (double)cVar6;
  particle._4_4_ = 0;
  do {
    iVar2 = logging::level();
    if ((0 < iVar2) && (iVar2 = logging::level(), 3 < iVar2)) {
      plVar7 = logging::stream(4);
      poVar8 = std::operator<<(&plVar7->super_ostream,"Simulation ");
      pvVar9 = (void *)std::ostream::operator<<(poVar8,particle._4_4_);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    }
    sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                      ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)streams_local);
    particle._0_4_ = Random::NextInt((Random *)&Random::RANDOM,(int)sVar5);
    pPVar1 = prior_local;
    ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)streams_local,
                         (long)(int)particle);
    iVar2 = (*pPVar1->_vptr_POMCPPrior[0x16])(pPVar1,*ppSVar3);
    local_a0 = (State *)CONCAT44(extraout_var,iVar2);
    POMCP::Simulate(local_a0,(RandomStreams *)model_local,pVStack_80,(DSPOMDP *)prior_local,
                    (POMCPPrior *)history_local);
    particle._4_4_ = particle._4_4_ + 1;
    (*prior_local->_vptr_POMCPPrior[0x17])(prior_local,local_a0);
    cVar6 = clock();
  } while (((double)cVar6 - _index) / 1000000.0 < local_38);
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar7 = logging::stream(3);
    poVar8 = std::operator<<(&plVar7->super_ostream,"[DPOMCP::ConstructTree] OptimalAction = ");
    VVar10 = POMCP::OptimalAction(pVStack_80);
    local_b0.value = VVar10.value;
    local_b0.action = VVar10.action;
    poVar8 = despot::operator<<(poVar8,&local_b0);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(poVar8,"# Simulations = ");
    iVar2 = VNode::count(pVStack_80);
    pvVar9 = (void *)std::ostream::operator<<(poVar8,iVar2);
    poVar8 = (ostream *)std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(poVar8,"# active particles after search = ");
    iVar2 = (*prior_local->_vptr_POMCPPrior[0x18])();
    pvVar9 = (void *)std::ostream::operator<<(poVar8,iVar2);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  }
  return pVStack_80;
}

Assistant:

VNode* DPOMCP::ConstructTree(vector<State*>& particles, RandomStreams& streams,
	const DSPOMDP* model, POMCPPrior* prior, History& history, double timeout) {
	prior->history(history);
	VNode* root = CreateVNode(0, particles[0], prior, model);

	for (int i = 0; i < particles.size(); i++)
		particles[i]->scenario_id = i;

	logi << "[DPOMCP::ConstructTree] # active particles before search = "
		<< model->NumActiveParticles() << endl;
	double start = clock();
	int num_sims = 0;
	while (true) {
		logd << "Simulation " << num_sims << endl;

		int index = Random::RANDOM.NextInt(particles.size());
		State* particle = model->Copy(particles[index]);
		Simulate(particle, streams, root, model, prior);
		num_sims++;
		model->Free(particle);

		if ((clock() - start) / CLOCKS_PER_SEC >= timeout) {
			break;
		}
	}

	logi << "[DPOMCP::ConstructTree] OptimalAction = " << OptimalAction(root)
		<< endl << "# Simulations = " << root->count() << endl
		<< "# active particles after search = " << model->NumActiveParticles()
		<< endl;

	return root;
}